

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::NavScoreItem(ImGuiNavMoveResult *result,ImRect cand)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  uint uVar4;
  ImRect *pIVar5;
  long in_RDI;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  ImVec2 in_XMM0_Qa;
  ImVec2 in_XMM1_Qa;
  bool new_best;
  float dist_axial;
  float day;
  float dax;
  ImGuiDir quadrant;
  float dist_center;
  float dcy;
  float dcx;
  float dist_box;
  float dby;
  float dbx;
  ImRect *curr;
  ImGuiWindow *window;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  ImGuiDir in_stack_ffffffffffffff94;
  bool local_61;
  float local_60;
  float local_5c;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  float fVar11;
  undefined4 in_stack_ffffffffffffffb4;
  float local_3c;
  ImRect local_14;
  bool local_1;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  if (GImGui->NavLayer == (pIVar1->DC).NavLayerCurrent) {
    pIVar5 = &GImGui->NavScoringRect;
    GImGui->NavScoringCount = GImGui->NavScoringCount + 1;
    local_14.Min = in_XMM0_Qa;
    local_14.Max = in_XMM1_Qa;
    if (pIVar1->ParentWindow == pIVar2->NavWindow) {
      bVar3 = ImRect::Overlaps(&pIVar1->ClipRect,&local_14);
      if (!bVar3) {
        return false;
      }
      ImRect::ClipWithFull
                ((ImRect *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 (ImRect *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    }
    NavClampRectToVisibleAreaForMoveDir
              (in_stack_ffffffffffffff94,
               (ImRect *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
               (ImRect *)0x149e10);
    local_3c = NavScoreItemDistInterval
                         (local_14.Min.x,local_14.Max.x,(pIVar5->Min).x,
                          (pIVar2->NavScoringRect).Max.x);
    fVar6 = ImLerp<float>(local_14.Min.y,local_14.Max.y,0.2);
    fVar7 = ImLerp<float>(local_14.Min.y,local_14.Max.y,0.8);
    fVar8 = ImLerp<float>((pIVar2->NavScoringRect).Min.y,(pIVar2->NavScoringRect).Max.y,0.2);
    fVar9 = ImLerp<float>((pIVar2->NavScoringRect).Min.y,(pIVar2->NavScoringRect).Max.y,0.8);
    fVar6 = NavScoreItemDistInterval(fVar6,fVar7,fVar8,fVar9);
    if (((fVar6 != 0.0) || (NAN(fVar6))) && ((local_3c != 0.0 || (NAN(local_3c))))) {
      local_3c = local_3c / 1000.0 +
                 (float)(~-(uint)(0.0 < local_3c) & 0xbf800000 |
                        -(uint)(0.0 < local_3c) & 0x3f800000);
    }
    fVar8 = ABS(local_3c) + ABS(fVar6);
    fVar7 = (local_14.Min.x + local_14.Max.x) - ((pIVar5->Min).x + (pIVar2->NavScoringRect).Max.x);
    fVar9 = (local_14.Min.y + local_14.Max.y) -
            ((pIVar2->NavScoringRect).Min.y + (pIVar2->NavScoringRect).Max.y);
    fVar10 = ABS(fVar7) + ABS(fVar9);
    local_5c = 0.0;
    local_60 = 0.0;
    if (((local_3c != 0.0) || (fVar6 != 0.0)) || (NAN(fVar6))) {
      fVar7 = local_3c;
      uVar4 = ImGetDirQuadrantFromDelta(local_3c,fVar6);
      local_60 = fVar8;
      local_5c = fVar6;
      fVar11 = fVar10;
    }
    else {
      fVar11 = fVar10;
      if (((fVar7 != 0.0) || (fVar9 != 0.0)) || (NAN(fVar9))) {
        uVar4 = ImGetDirQuadrantFromDelta(fVar7,fVar9);
        local_60 = fVar10;
        local_5c = fVar9;
      }
      else {
        uVar4 = (uint)(pIVar2->NavId <= (pIVar1->DC).LastItemId);
        fVar7 = 0.0;
      }
    }
    local_61 = false;
    if (uVar4 == pIVar2->NavMoveDir) {
      if (fVar8 < *(float *)(in_RDI + 0x10)) {
        *(float *)(in_RDI + 0x10) = fVar8;
        *(float *)(in_RDI + 0x14) = fVar11;
        return true;
      }
      if ((fVar8 == *(float *)(in_RDI + 0x10)) && (!NAN(fVar8) && !NAN(*(float *)(in_RDI + 0x10))))
      {
        if (*(float *)(in_RDI + 0x14) <= fVar11) {
          if ((fVar11 == *(float *)(in_RDI + 0x14)) &&
             (!NAN(fVar11) && !NAN(*(float *)(in_RDI + 0x14)))) {
            if ((pIVar2->NavMoveDir != 2) && (pIVar2->NavMoveDir != 3)) {
              fVar6 = local_3c;
            }
            local_61 = fVar6 < 0.0;
          }
        }
        else {
          *(float *)(in_RDI + 0x14) = fVar11;
          local_61 = true;
        }
      }
    }
    if (((((*(float *)(in_RDI + 0x10) == 3.4028235e+38) && (!NAN(*(float *)(in_RDI + 0x10)))) &&
         (local_60 < *(float *)(in_RDI + 0x18))) &&
        ((pIVar2->NavLayer == ImGuiNavLayer_Menu && ((pIVar2->NavWindow->Flags & 0x10000000U) == 0))
        )) && (((((pIVar2->NavMoveDir == 0 && (fVar7 < 0.0)) ||
                 ((pIVar2->NavMoveDir == 1 && (0.0 < fVar7)))) ||
                ((pIVar2->NavMoveDir == 2 && (local_5c < 0.0)))) ||
               ((pIVar2->NavMoveDir == 3 && (0.0 < local_5c)))))) {
      *(float *)(in_RDI + 0x18) = local_60;
      local_61 = true;
    }
    local_1 = local_61;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool ImGui::NavScoreItem(ImGuiNavMoveResult* result, ImRect cand)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (g.NavLayer != window->DC.NavLayerCurrent)
        return false;

    const ImRect& curr = g.NavScoringRect; // Current modified source rect (NB: we've applied Max.x = Min.x in NavUpdate() to inhibit the effect of having varied item width)
    g.NavScoringCount++;

    // When entering through a NavFlattened border, we consider child window items as fully clipped for scoring
    if (window->ParentWindow == g.NavWindow)
    {
        IM_ASSERT((window->Flags | g.NavWindow->Flags) & ImGuiWindowFlags_NavFlattened);
        if (!window->ClipRect.Overlaps(cand))
            return false;
        cand.ClipWithFull(window->ClipRect); // This allows the scored item to not overlap other candidates in the parent window
    }

    // We perform scoring on items bounding box clipped by the current clipping rectangle on the other axis (clipping on our movement axis would give us equal scores for all clipped items)
    // For example, this ensure that items in one column are not reached when moving vertically from items in another column.
    NavClampRectToVisibleAreaForMoveDir(g.NavMoveClipDir, cand, window->ClipRect);

    // Compute distance between boxes
    // FIXME-NAV: Introducing biases for vertical navigation, needs to be removed.
    float dbx = NavScoreItemDistInterval(cand.Min.x, cand.Max.x, curr.Min.x, curr.Max.x);
    float dby = NavScoreItemDistInterval(ImLerp(cand.Min.y, cand.Max.y, 0.2f), ImLerp(cand.Min.y, cand.Max.y, 0.8f), ImLerp(curr.Min.y, curr.Max.y, 0.2f), ImLerp(curr.Min.y, curr.Max.y, 0.8f)); // Scale down on Y to keep using box-distance for vertically touching items
    if (dby != 0.0f && dbx != 0.0f)
        dbx = (dbx / 1000.0f) + ((dbx > 0.0f) ? +1.0f : -1.0f);
    float dist_box = ImFabs(dbx) + ImFabs(dby);

    // Compute distance between centers (this is off by a factor of 2, but we only compare center distances with each other so it doesn't matter)
    float dcx = (cand.Min.x + cand.Max.x) - (curr.Min.x + curr.Max.x);
    float dcy = (cand.Min.y + cand.Max.y) - (curr.Min.y + curr.Max.y);
    float dist_center = ImFabs(dcx) + ImFabs(dcy); // L1 metric (need this for our connectedness guarantee)

    // Determine which quadrant of 'curr' our candidate item 'cand' lies in based on distance
    ImGuiDir quadrant;
    float dax = 0.0f, day = 0.0f, dist_axial = 0.0f;
    if (dbx != 0.0f || dby != 0.0f)
    {
        // For non-overlapping boxes, use distance between boxes
        dax = dbx;
        day = dby;
        dist_axial = dist_box;
        quadrant = ImGetDirQuadrantFromDelta(dbx, dby);
    }
    else if (dcx != 0.0f || dcy != 0.0f)
    {
        // For overlapping boxes with different centers, use distance between centers
        dax = dcx;
        day = dcy;
        dist_axial = dist_center;
        quadrant = ImGetDirQuadrantFromDelta(dcx, dcy);
    }
    else
    {
        // Degenerate case: two overlapping buttons with same center, break ties arbitrarily (note that LastItemId here is really the _previous_ item order, but it doesn't matter)
        quadrant = (window->DC.LastItemId < g.NavId) ? ImGuiDir_Left : ImGuiDir_Right;
    }

#if IMGUI_DEBUG_NAV_SCORING
    char buf[128];
    if (IsMouseHoveringRect(cand.Min, cand.Max))
    {
        ImFormatString(buf, IM_ARRAYSIZE(buf), "dbox (%.2f,%.2f->%.4f)\ndcen (%.2f,%.2f->%.4f)\nd (%.2f,%.2f->%.4f)\nnav %c, quadrant %c", dbx, dby, dist_box, dcx, dcy, dist_center, dax, day, dist_axial, "WENS"[g.NavMoveDir], "WENS"[quadrant]);
        ImDrawList* draw_list = GetForegroundDrawList(window);
        draw_list->AddRect(curr.Min, curr.Max, IM_COL32(255,200,0,100));
        draw_list->AddRect(cand.Min, cand.Max, IM_COL32(255,255,0,200));
        draw_list->AddRectFilled(cand.Max - ImVec2(4, 4), cand.Max + CalcTextSize(buf) + ImVec2(4, 4), IM_COL32(40,0,0,150));
        draw_list->AddText(g.IO.FontDefault, 13.0f, cand.Max, ~0U, buf);
    }
    else if (g.IO.KeyCtrl) // Hold to preview score in matching quadrant. Press C to rotate.
    {
        if (IsKeyPressedMap(ImGuiKey_C)) { g.NavMoveDirLast = (ImGuiDir)((g.NavMoveDirLast + 1) & 3); g.IO.KeysDownDuration[g.IO.KeyMap[ImGuiKey_C]] = 0.01f; }
        if (quadrant == g.NavMoveDir)
        {
            ImFormatString(buf, IM_ARRAYSIZE(buf), "%.0f/%.0f", dist_box, dist_center);
            ImDrawList* draw_list = GetForegroundDrawList(window);
            draw_list->AddRectFilled(cand.Min, cand.Max, IM_COL32(255, 0, 0, 200));
            draw_list->AddText(g.IO.FontDefault, 13.0f, cand.Min, IM_COL32(255, 255, 255, 255), buf);
        }
    }
#endif

    // Is it in the quadrant we're interesting in moving to?
    bool new_best = false;
    if (quadrant == g.NavMoveDir)
    {
        // Does it beat the current best candidate?
        if (dist_box < result->DistBox)
        {
            result->DistBox = dist_box;
            result->DistCenter = dist_center;
            return true;
        }
        if (dist_box == result->DistBox)
        {
            // Try using distance between center points to break ties
            if (dist_center < result->DistCenter)
            {
                result->DistCenter = dist_center;
                new_best = true;
            }
            else if (dist_center == result->DistCenter)
            {
                // Still tied! we need to be extra-careful to make sure everything gets linked properly. We consistently break ties by symbolically moving "later" items
                // (with higher index) to the right/downwards by an infinitesimal amount since we the current "best" button already (so it must have a lower index),
                // this is fairly easy. This rule ensures that all buttons with dx==dy==0 will end up being linked in order of appearance along the x axis.
                if (((g.NavMoveDir == ImGuiDir_Up || g.NavMoveDir == ImGuiDir_Down) ? dby : dbx) < 0.0f) // moving bj to the right/down decreases distance
                    new_best = true;
            }
        }
    }

    // Axial check: if 'curr' has no link at all in some direction and 'cand' lies roughly in that direction, add a tentative link. This will only be kept if no "real" matches
    // are found, so it only augments the graph produced by the above method using extra links. (important, since it doesn't guarantee strong connectedness)
    // This is just to avoid buttons having no links in a particular direction when there's a suitable neighbor. you get good graphs without this too.
    // 2017/09/29: FIXME: This now currently only enabled inside menu bars, ideally we'd disable it everywhere. Menus in particular need to catch failure. For general navigation it feels awkward.
    // Disabling it may lead to disconnected graphs when nodes are very spaced out on different axis. Perhaps consider offering this as an option?
    if (result->DistBox == FLT_MAX && dist_axial < result->DistAxial)  // Check axial match
        if (g.NavLayer == ImGuiNavLayer_Menu && !(g.NavWindow->Flags & ImGuiWindowFlags_ChildMenu))
            if ((g.NavMoveDir == ImGuiDir_Left && dax < 0.0f) || (g.NavMoveDir == ImGuiDir_Right && dax > 0.0f) || (g.NavMoveDir == ImGuiDir_Up && day < 0.0f) || (g.NavMoveDir == ImGuiDir_Down && day > 0.0f))
            {
                result->DistAxial = dist_axial;
                new_best = true;
            }

    return new_best;
}